

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDD mtbdd_fraction(int64_t nom,uint64_t denom)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  long local_30;
  uint32_t c;
  uint64_t denom_local;
  int64_t nom_local;
  
  if (nom == 0) {
    nom_local = mtbdd_makeleaf(2,1);
  }
  else {
    local_30 = nom;
    if (nom < 0) {
      local_30 = -nom;
    }
    uVar1 = gcd((uint32_t)local_30,(uint32_t)denom);
    lVar2 = nom / (long)(ulong)uVar1;
    uVar3 = denom / uVar1;
    if (((0x7fffffff < lVar2) || (lVar2 < -0x7fffffff)) || (0xffffffff < uVar3)) {
      fprintf(_stderr,"mtbdd_fraction: fraction overflow\n",denom % (ulong)uVar1);
    }
    nom_local = mtbdd_makeleaf(2,lVar2 << 0x20 | uVar3);
  }
  return nom_local;
}

Assistant:

MTBDD
mtbdd_fraction(int64_t nom, uint64_t denom)
{
    if (nom == 0) return mtbdd_makeleaf(2, 1);
    uint32_t c = gcd(nom < 0 ? -nom : nom, denom);
    nom /= c;
    denom /= c;
    if (nom > 2147483647 || nom < -2147483647 || denom > 4294967295) fprintf(stderr, "mtbdd_fraction: fraction overflow\n");
    return mtbdd_makeleaf(2, (nom<<32)|denom);
}